

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O3

int test_cloned_monster(flatcc_builder_t *B)

{
  flatcc_refmap_t *pfVar1;
  int iVar2;
  MyGame_Example_Monster_ref_t root;
  flatcc_builder_ref_t fVar3;
  uint *addr;
  char *pcVar4;
  void *addr_00;
  MyGame_Example_Monster_table_t t;
  size_t size;
  flatcc_refmap_t refmap;
  size_t local_d0;
  flatcc_refmap_t local_c8;
  
  local_c8.count = 0;
  local_c8.buckets = 0;
  local_c8.table = (flatcc_refmap_item *)0x0;
  gen_monster(B,0);
  addr = (uint *)flatcc_builder_finalize_aligned_buffer(B,&local_d0);
  hexdump("monster table",addr,local_d0,_stderr);
  iVar2 = flatcc_verify_table_as_root(addr,local_d0,"MONS",MyGame_Example_Monster_verify_table);
  if (iVar2 != 0) {
    pcVar4 = flatcc_verify_error_string(iVar2);
    printf("Monster buffer failed to verify, got: %s\n",pcVar4);
    return -1;
  }
  iVar2 = verify_monster(addr);
  if (iVar2 != 0) {
    return -1;
  }
  flatcc_builder_reset(B);
  pfVar1 = B->refmap;
  B->refmap = &local_c8;
  if ((addr == (uint *)0x0) || (addr[1] != 0x534e4f4d)) {
    t = (MyGame_Example_Monster_table_t)0x0;
  }
  else {
    t = (MyGame_Example_Monster_table_t)((long)addr + (ulong)*addr);
  }
  iVar2 = flatcc_builder_start_buffer(B,"MONS",0,0);
  if (iVar2 == 0) {
    root = MyGame_Example_Monster_clone(B,t);
    fVar3 = flatcc_builder_end_buffer(B,root);
    if (fVar3 != 0) {
      B->refmap = pfVar1;
      addr_00 = flatcc_builder_finalize_aligned_buffer(B,&local_d0);
      hexdump("cloned monster table",addr_00,local_d0,_stderr);
      iVar2 = flatcc_verify_table_as_root
                        (addr_00,local_d0,"MONS",MyGame_Example_Monster_verify_table);
      if (iVar2 != 0) {
        pcVar4 = flatcc_verify_error_string(iVar2);
        printf("Cloned Monster buffer failed to verify, got: %s\n",pcVar4);
        return -1;
      }
      iVar2 = verify_monster(addr_00);
      if (iVar2 == 0) {
        flatcc_refmap_clear(&local_c8);
        flatcc_builder_aligned_free(addr);
        flatcc_builder_aligned_free(addr_00);
        return 0;
      }
      pcVar4 = "Cloned Monster did not have the expected content.";
      goto LAB_00106879;
    }
  }
  pcVar4 = "Cloned Monster didn\'t actually clone.";
LAB_00106879:
  printf(pcVar4);
  return -1;
}

Assistant:

int test_cloned_monster(flatcc_builder_t *B)
{
    void *buffer;
    void *cloned_buffer;
    size_t size;
    int ret;
    flatcc_refmap_t refmap, *refmap_old;

    flatcc_refmap_init(&refmap);
    gen_monster(B, 0);

    buffer = flatcc_builder_finalize_aligned_buffer(B, &size);
    hexdump("monster table", buffer, size, stderr);
    if ((ret = ns(Monster_verify_as_root(buffer, size)))) {
        printf("Monster buffer failed to verify, got: %s\n", flatcc_verify_error_string(ret));
        return -1;
    }
    if (verify_monster(buffer)) {
        return -1;
    }
    flatcc_builder_reset(B);

    /*
     * Clone works without setting a refmap - but then shared references
     * get expanded - and then the verify monster check fails on a DAG
     * test.
     */
    refmap_old = flatcc_builder_set_refmap(B, &refmap);
    if (!ns(Monster_clone_as_root(B, ns(Monster_as_root(buffer))))) {
        printf("Cloned Monster didn't actually clone.");
        return -1;
    };
    /*
     * Restoring old refmap (or zeroing) is optional if we cleared the
     * buffer in this scope, but we don't so we must detach and clean up
     * the refmap manually. refmap_old is likely just null, but this
     * way we do not interfere with caller.
     */
    flatcc_builder_set_refmap(B, refmap_old);
    cloned_buffer = flatcc_builder_finalize_aligned_buffer(B, &size);
    hexdump("cloned monster table", cloned_buffer, size, stderr);
    if ((ret = ns(Monster_verify_as_root(cloned_buffer, size)))) {
        printf("Cloned Monster buffer failed to verify, got: %s\n", flatcc_verify_error_string(ret));
        return -1;
    }
    if (verify_monster(cloned_buffer)) {
        printf("Cloned Monster did not have the expected content.");
        return -1;
    }

    flatcc_refmap_clear(&refmap);
    flatcc_builder_aligned_free(buffer);
    flatcc_builder_aligned_free(cloned_buffer);
    return ret;
}